

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACLoader.cpp
# Opt level: O0

void __thiscall
Assimp::AC3DImporter::LoadObjectSection
          (AC3DImporter *this,
          vector<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
          *objects)

{
  float fVar1;
  vector<aiLight_*,_std::allocator<aiLight_*>_> *this_00;
  aiString *paVar2;
  vector<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_> *this_01;
  bool bVar3;
  int iVar4;
  ai_uint32 aVar5;
  uint uVar6;
  aiLight *this_02;
  aiColor3D *o;
  size_type sVar7;
  Logger *pLVar8;
  DeadlyImportError *pDVar9;
  vector<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
  *this_03;
  reference pvVar10;
  char *pcVar11;
  int iVar12;
  ai_real aVar13;
  uint local_2dc;
  uint i_8;
  SurfaceEntry *entry;
  uint local_2c4;
  uint local_2c0;
  uint k;
  uint m;
  reference local_298;
  Surface *surf;
  uint local_270;
  uint local_26c;
  uint i_7;
  uint t_1;
  bool Q3DWorkAround;
  reference pvStack_260;
  uint i_6;
  aiVector3D *v;
  uint local_248;
  undefined1 local_242;
  allocator<char> local_241;
  uint i_5;
  uint local_220;
  uint local_21c;
  uint t;
  uint i_4;
  uint i_3;
  uint i_2;
  uint local_208;
  allocator local_201;
  uint i_1;
  char *local_1e0;
  char *sz_1;
  string local_1d0;
  allocator local_1a9;
  string local_1a8 [32];
  char *local_188;
  char *sz;
  string local_178;
  uint local_154;
  uint local_150;
  uint i;
  uint num;
  aiColor3D local_124;
  value_type local_118;
  aiLight *light;
  Object *obj;
  Object local_f8;
  vector<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_> *local_18;
  vector<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_> *objects_local
  ;
  AC3DImporter *this_local;
  
  local_18 = objects;
  objects_local =
       (vector<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_> *)this;
  bVar3 = TokenMatch<char_const>(&this->buffer,"OBJECT",6);
  if (bVar3) {
    SkipSpaces<char>(&this->buffer);
    this_01 = local_18;
    this->mNumMeshes = this->mNumMeshes + 1;
    Object::Object(&local_f8);
    std::vector<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>::
    push_back(this_01,&local_f8);
    Object::~Object(&local_f8);
    light = (aiLight *)
            std::vector<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
            ::back(local_18);
    local_118 = (aiLight *)0x0;
    iVar4 = ASSIMP_strincmp(this->buffer,"light",5);
    if (iVar4 == 0) {
      this_00 = this->mLights;
      this_02 = (aiLight *)operator_new(0x46c);
      aiLight::aiLight(this_02);
      local_118 = this_02;
      std::vector<aiLight_*,_std::allocator<aiLight_*>_>::push_back(this_00,&local_118);
      local_118->mType = aiLightSource_POINT;
      aiColor3D::aiColor3D(&local_124,1.0,1.0,1.0);
      o = aiColor3D::operator=(&local_118->mColorSpecular,&local_124);
      aiColor3D::operator=(&local_118->mColorDiffuse,o);
      local_118->mAttenuationConstant = 1.0;
      paVar2 = &local_118->mName;
      sVar7 = std::vector<aiLight_*,_std::allocator<aiLight_*>_>::size(this->mLights);
      aVar5 = snprintf(paVar2->data,0x400,"ACLight_%i",(ulong)((int)sVar7 - 1));
      (local_118->mName).length = aVar5;
      paVar2 = &local_118->mName;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&num,paVar2->data,(allocator<char> *)((long)&i + 3));
      std::__cxx11::string::operator=((string *)((light->mName).data + 4),(string *)&num);
      std::__cxx11::string::~string((string *)&num);
      std::allocator<char>::~allocator((allocator<char> *)((long)&i + 3));
      pLVar8 = DefaultLogger::get();
      Logger::debug(pLVar8,"AC3D: Light source encountered");
      (light->mName).length = 4;
    }
    else {
      iVar4 = ASSIMP_strincmp(this->buffer,"group",5);
      if (iVar4 == 0) {
        (light->mName).length = 2;
      }
      else {
        iVar4 = ASSIMP_strincmp(this->buffer,"world",5);
        if (iVar4 == 0) {
          (light->mName).length = 0;
        }
        else {
          (light->mName).length = 1;
        }
      }
    }
LAB_00610712:
    bVar3 = GetNextLine(this);
    if (bVar3) {
      bVar3 = TokenMatch<char_const>(&this->buffer,"kids",4);
      if (bVar3) {
        SkipSpaces<char>(&this->buffer);
        local_150 = strtoul10(this->buffer,&this->buffer);
        GetNextLine(this);
        if (local_150 == 0) {
          return;
        }
        std::vector<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>::
        reserve((vector<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
                 *)((light->mName).data + 0x24),(ulong)local_150);
        for (local_154 = 0; local_154 < local_150; local_154 = local_154 + 1) {
          LoadObjectSection(this,(vector<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
                                  *)((light->mName).data + 0x24));
        }
        return;
      }
      bVar3 = TokenMatch<char_const>(&this->buffer,"name",4);
      if (bVar3) {
        SkipSpaces<char>(&this->buffer);
        if (*this->buffer == '\0') {
          sz._6_1_ = 1;
          pDVar9 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_178,"AC3D: Unexpected EOF in string",
                     (allocator<char> *)((long)&sz + 7));
          DeadlyImportError::DeadlyImportError(pDVar9,&local_178);
          sz._6_1_ = 0;
          __cxa_throw(pDVar9,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
        }
        this->buffer = this->buffer + 1;
        local_188 = this->buffer;
        while (*this->buffer != '\"') {
          bVar3 = IsLineEnd<char>(*this->buffer);
          if (bVar3) {
            pLVar8 = DefaultLogger::get();
            Logger::error(pLVar8,"AC3D: Unexpected EOF/EOL in string");
            std::__cxx11::string::operator=((string *)((light->mName).data + 4),"ERROR");
            break;
          }
          this->buffer = this->buffer + 1;
        }
        bVar3 = IsLineEnd<char>(*this->buffer);
        pcVar11 = local_188;
        if (!bVar3) {
          iVar4 = *(int *)&this->buffer;
          iVar12 = (int)local_188;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1a8,pcVar11,(ulong)(uint)(iVar4 - iVar12),&local_1a9);
          std::__cxx11::string::operator=((string *)((light->mName).data + 4),local_1a8);
          std::__cxx11::string::~string(local_1a8);
          std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
          this->buffer = this->buffer + 1;
          if (local_118 != (aiLight *)0x0) {
            aiString::Set(&local_118->mName,(string *)((light->mName).data + 4));
          }
        }
      }
      else {
        bVar3 = TokenMatch<char_const>(&this->buffer,"texture",7);
        if (bVar3) {
          SkipSpaces<char>(&this->buffer);
          if (*this->buffer == '\0') {
            sz_1._6_1_ = 1;
            pDVar9 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1d0,"AC3D: Unexpected EOF in string",
                       (allocator<char> *)((long)&sz_1 + 7));
            DeadlyImportError::DeadlyImportError(pDVar9,&local_1d0);
            sz_1._6_1_ = 0;
            __cxa_throw(pDVar9,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
          }
          this->buffer = this->buffer + 1;
          local_1e0 = this->buffer;
          while (*this->buffer != '\"') {
            bVar3 = IsLineEnd<char>(*this->buffer);
            if (bVar3) {
              pLVar8 = DefaultLogger::get();
              Logger::error(pLVar8,"AC3D: Unexpected EOF/EOL in string");
              std::__cxx11::string::operator=((string *)((light->mName).data + 0x3c),"ERROR");
              break;
            }
            this->buffer = this->buffer + 1;
          }
          bVar3 = IsLineEnd<char>(*this->buffer);
          pcVar11 = local_1e0;
          if (!bVar3) {
            iVar4 = *(int *)&this->buffer;
            iVar12 = (int)local_1e0;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&i_1,pcVar11,(ulong)(uint)(iVar4 - iVar12),&local_201);
            std::__cxx11::string::operator=((string *)((light->mName).data + 0x3c),(string *)&i_1);
            std::__cxx11::string::~string((string *)&i_1);
            std::allocator<char>::~allocator((allocator<char> *)&local_201);
            this->buffer = this->buffer + 1;
          }
        }
        else {
          bVar3 = TokenMatch<char_const>(&this->buffer,"texrep",6);
          if (bVar3) {
            SkipSpaces<char>(&this->buffer);
            bVar3 = SkipSpaces<char>(&this->buffer);
            if (bVar3) {
              for (local_208 = 0; local_208 < 2; local_208 = local_208 + 1) {
                bVar3 = SkipSpaces<char>(&this->buffer);
                if (bVar3) {
                  pcVar11 = fast_atoreal_move<float>
                                      (this->buffer,
                                       (float *)((light->mName).data + (ulong)local_208 * 4 + 0x5c),
                                       true);
                  this->buffer = pcVar11;
                }
                else {
                  pLVar8 = DefaultLogger::get();
                  Logger::error(pLVar8,"AC3D: Unexpected EOF/EOL");
                }
              }
              fVar1 = *(float *)((light->mName).data + 0x5c);
              if (((fVar1 == 0.0) && (!NAN(fVar1))) ||
                 ((fVar1 = *(float *)((light->mName).data + 0x60), fVar1 == 0.0 && (!NAN(fVar1)))))
              {
                aiVector2t<float>::aiVector2t((aiVector2t<float> *)&i_3,1.0,1.0);
                *(aiVector2t<float> *)((light->mName).data + 0x5c) = _i_3;
              }
            }
            else {
              pLVar8 = DefaultLogger::get();
              Logger::error(pLVar8,"AC3D: Unexpected EOF/EOL");
            }
          }
          else {
            bVar3 = TokenMatch<char_const>(&this->buffer,"texoff",6);
            if (bVar3) {
              SkipSpaces<char>(&this->buffer);
              bVar3 = SkipSpaces<char>(&this->buffer);
              if (bVar3) {
                for (i_4 = 0; i_4 < 2; i_4 = i_4 + 1) {
                  bVar3 = SkipSpaces<char>(&this->buffer);
                  if (bVar3) {
                    pcVar11 = fast_atoreal_move<float>
                                        (this->buffer,
                                         (float *)((light->mName).data + (ulong)i_4 * 4 + 100),true)
                    ;
                    this->buffer = pcVar11;
                  }
                  else {
                    pLVar8 = DefaultLogger::get();
                    Logger::error(pLVar8,"AC3D: Unexpected EOF/EOL");
                  }
                }
              }
              else {
                pLVar8 = DefaultLogger::get();
                Logger::error(pLVar8,"AC3D: Unexpected EOF/EOL");
              }
            }
            else {
              bVar3 = TokenMatch<char_const>(&this->buffer,"rot",3);
              if (bVar3) {
                SkipSpaces<char>(&this->buffer);
                bVar3 = SkipSpaces<char>(&this->buffer);
                if (bVar3) {
                  for (t = 0; t < 9; t = t + 1) {
                    bVar3 = SkipSpaces<char>(&this->buffer);
                    if (bVar3) {
                      pcVar11 = fast_atoreal_move<float>
                                          (this->buffer,
                                           (float *)((light->mName).data + (ulong)t * 4 + 0x6c),true
                                          );
                      this->buffer = pcVar11;
                    }
                    else {
                      pLVar8 = DefaultLogger::get();
                      Logger::error(pLVar8,"AC3D: Unexpected EOF/EOL");
                    }
                  }
                }
                else {
                  pLVar8 = DefaultLogger::get();
                  Logger::error(pLVar8,"AC3D: Unexpected EOF/EOL");
                }
              }
              else {
                bVar3 = TokenMatch<char_const>(&this->buffer,"loc",3);
                if (bVar3) {
                  SkipSpaces<char>(&this->buffer);
                  bVar3 = SkipSpaces<char>(&this->buffer);
                  if (bVar3) {
                    for (local_21c = 0; local_21c < 3; local_21c = local_21c + 1) {
                      bVar3 = SkipSpaces<char>(&this->buffer);
                      if (bVar3) {
                        pcVar11 = fast_atoreal_move<float>
                                            (this->buffer,
                                             (float *)((light->mName).data +
                                                      (ulong)local_21c * 4 + 0x90),true);
                        this->buffer = pcVar11;
                      }
                      else {
                        pLVar8 = DefaultLogger::get();
                        Logger::error(pLVar8,"AC3D: Unexpected EOF/EOL");
                      }
                    }
                  }
                  else {
                    pLVar8 = DefaultLogger::get();
                    Logger::error(pLVar8,"AC3D: Unexpected EOF/EOL");
                  }
                }
                else {
                  bVar3 = TokenMatch<char_const>(&this->buffer,"subdiv",6);
                  if (bVar3) {
                    SkipSpaces<char>(&this->buffer);
                    uVar6 = strtoul10(this->buffer,&this->buffer);
                    *(uint *)((light->mName).data + 0xd0) = uVar6;
                  }
                  else {
                    bVar3 = TokenMatch<char_const>(&this->buffer,"crease",6);
                    if (bVar3) {
                      SkipSpaces<char>(&this->buffer);
                      aVar13 = fast_atof(this->buffer);
                      *(ai_real *)((light->mName).data + 0xd4) = aVar13;
                    }
                    else {
                      bVar3 = TokenMatch<char_const>(&this->buffer,"numvert",7);
                      if (bVar3) {
                        SkipSpaces<char>(&this->buffer);
                        local_220 = strtoul10(this->buffer,&this->buffer);
                        if (0x1555554 < local_220) {
                          local_242 = 1;
                          pDVar9 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&i_5,
                                     "AC3D: Too many vertices, would run out of memory",&local_241);
                          DeadlyImportError::DeadlyImportError(pDVar9,(string *)&i_5);
                          local_242 = 0;
                          __cxa_throw(pDVar9,&DeadlyImportError::typeinfo,
                                      DeadlyImportError::~DeadlyImportError);
                        }
                        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
                                  ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *
                                   )((light->mName).data + 0x9c),(ulong)local_220);
                        for (local_248 = 0; local_248 < local_220; local_248 = local_248 + 1) {
                          bVar3 = GetNextLine(this);
                          if (!bVar3) {
                            pLVar8 = DefaultLogger::get();
                            Logger::error(pLVar8,
                                          "AC3D: Unexpected EOF: not all vertices have been parsed yet"
                                         );
                            break;
                          }
                          bVar3 = IsNumeric<char>(*this->buffer);
                          if (!bVar3) {
                            pLVar8 = DefaultLogger::get();
                            Logger::error(pLVar8,
                                          "AC3D: Unexpected token: not all vertices have been parsed yet"
                                         );
                            this->buffer = this->buffer + -1;
                            break;
                          }
                          paVar2 = &light->mName;
                          aiVector3t<float>::aiVector3t((aiVector3t<float> *)((long)&v + 4));
                          std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::
                          push_back((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                     *)(paVar2->data + 0x9c),(value_type *)((long)&v + 4));
                          pvStack_260 = std::
                                        vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                        ::back((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                                *)((light->mName).data + 0x9c));
                          bVar3 = SkipSpaces<char>(&this->buffer);
                          if (bVar3) {
                            for (t_1 = 0; t_1 < 3; t_1 = t_1 + 1) {
                              bVar3 = SkipSpaces<char>(&this->buffer);
                              if (bVar3) {
                                pcVar11 = fast_atoreal_move<float>
                                                    (this->buffer,&pvStack_260->x + t_1,true);
                                this->buffer = pcVar11;
                              }
                              else {
                                pLVar8 = DefaultLogger::get();
                                Logger::error(pLVar8,"AC3D: Unexpected EOF/EOL");
                              }
                            }
                          }
                          else {
                            pLVar8 = DefaultLogger::get();
                            Logger::error(pLVar8,"AC3D: Unexpected EOF/EOL");
                          }
                        }
                      }
                      else {
                        bVar3 = TokenMatch<char_const>(&this->buffer,"numsurf",7);
                        if (bVar3) {
                          SkipSpaces<char>(&this->buffer);
                          i_7._3_1_ = 0;
                          local_26c = strtoul10(this->buffer,&this->buffer);
                          std::
                          vector<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>
                          ::reserve((vector<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>
                                     *)((light->mName).data + 0xb4),(ulong)local_26c);
                          for (local_270 = 0; local_270 < local_26c; local_270 = local_270 + 1) {
                            GetNextLine(this);
                            bVar3 = TokenMatch<char_const>(&this->buffer,"SURF",4);
                            if (!bVar3) {
                              if ((i_7._3_1_ & 1) == 0) {
                                pLVar8 = DefaultLogger::get();
                                Logger::warn(pLVar8,"AC3D: SURF token was expected");
                                pLVar8 = DefaultLogger::get();
                                Logger::debug(pLVar8,"Continuing with Quick3D Workaround enabled");
                              }
                              this->buffer = this->buffer + -1;
                              i_7._3_1_ = 1;
                            }
                            SkipSpaces<char>(&this->buffer);
                            paVar2 = &light->mName;
                            Surface::Surface((Surface *)&surf);
                            std::
                            vector<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>
                            ::push_back((vector<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>
                                         *)(paVar2->data + 0xb4),(Surface *)&surf);
                            Surface::~Surface((Surface *)&surf);
                            local_298 = std::
                                        vector<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>
                                        ::back((vector<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>
                                                *)((light->mName).data + 0xb4));
                            uVar6 = strtoul_cppstyle(this->buffer,(char **)0x0);
                            local_298->flags = uVar6;
LAB_0061169d:
                            while( true ) {
                              bVar3 = GetNextLine(this);
                              if (!bVar3) {
                                k._2_1_ = 1;
                                pDVar9 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&m,
                                           "AC3D: Unexpected EOF: surface is incomplete",
                                           (allocator<char> *)((long)&k + 3));
                                DeadlyImportError::DeadlyImportError(pDVar9,(string *)&m);
                                k._2_1_ = 0;
                                __cxa_throw(pDVar9,&DeadlyImportError::typeinfo,
                                            DeadlyImportError::~DeadlyImportError);
                              }
                              bVar3 = TokenMatch<char_const>(&this->buffer,"mat",3);
                              if (!bVar3) break;
                              SkipSpaces<char>(&this->buffer);
                              uVar6 = strtoul10(this->buffer,(char **)0x0);
                              local_298->mat = uVar6;
                            }
                            bVar3 = TokenMatch<char_const>(&this->buffer,"refs",4);
                            if (!bVar3) {
                              this->buffer = this->buffer + -1;
                              goto LAB_00611a63;
                            }
                            if (((i_7._3_1_ & 1) == 0) ||
                               (bVar3 = std::
                                        vector<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                                        ::empty(&local_298->entries), bVar3)) {
                              SkipSpaces<char>(&this->buffer);
                              local_2c0 = strtoul10(this->buffer,(char **)0x0);
                              std::
                              vector<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                              ::reserve(&local_298->entries,(ulong)local_2c0);
                              *(uint *)((light->mName).data + 0xcc) =
                                   local_2c0 + *(int *)((light->mName).data + 0xcc);
                              for (local_2c4 = 0; local_2c4 < local_2c0; local_2c4 = local_2c4 + 1)
                              {
                                bVar3 = GetNextLine(this);
                                if (!bVar3) {
                                  pLVar8 = DefaultLogger::get();
                                  Logger::error(pLVar8,
                                                "AC3D: Unexpected EOF: surface references are incomplete"
                                               );
                                  break;
                                }
                                this_03 = &local_298->entries;
                                std::pair<unsigned_int,_aiVector2t<float>_>::
                                pair<unsigned_int,_aiVector2t<float>,_true>
                                          ((pair<unsigned_int,_aiVector2t<float>_> *)&entry);
                                std::
                                vector<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                                ::push_back(this_03,(value_type *)&entry);
                                pvVar10 = std::
                                          vector<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                                          ::back(&local_298->entries);
                                uVar6 = strtoul10(this->buffer,&this->buffer);
                                pvVar10->first = uVar6;
                                SkipSpaces<char>(&this->buffer);
                                bVar3 = SkipSpaces<char>(&this->buffer);
                                if (bVar3) {
                                  for (local_2dc = 0; local_2dc < 2; local_2dc = local_2dc + 1) {
                                    bVar3 = SkipSpaces<char>(&this->buffer);
                                    if (bVar3) {
                                      pcVar11 = fast_atoreal_move<float>
                                                          (this->buffer,
                                                           &(pvVar10->second).x + local_2dc,true);
                                      this->buffer = pcVar11;
                                    }
                                    else {
                                      pLVar8 = DefaultLogger::get();
                                      Logger::error(pLVar8,"AC3D: Unexpected EOF/EOL");
                                    }
                                  }
                                }
                                else {
                                  pLVar8 = DefaultLogger::get();
                                  Logger::error(pLVar8,"AC3D: Unexpected EOF/EOL");
                                }
                              }
                              goto LAB_0061169d;
                            }
                            this->buffer = this->buffer + -6;
LAB_00611a63:
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      goto LAB_00610712;
    }
    pLVar8 = DefaultLogger::get();
    Logger::error(pLVar8,"AC3D: Unexpected EOF: \'kids\' line was expected");
  }
  return;
}

Assistant:

void AC3DImporter::LoadObjectSection(std::vector<Object>& objects)
{
    if (!TokenMatch(buffer,"OBJECT",6))
        return;

    SkipSpaces(&buffer);

    ++mNumMeshes;

    objects.push_back(Object());
    Object& obj = objects.back();

    aiLight* light = NULL;
    if (!ASSIMP_strincmp(buffer,"light",5))
    {
        // This is a light source. Add it to the list
        mLights->push_back(light = new aiLight());

        // Return a point light with no attenuation
        light->mType = aiLightSource_POINT;
        light->mColorDiffuse = light->mColorSpecular = aiColor3D(1.f,1.f,1.f);
        light->mAttenuationConstant = 1.f;

        // Generate a default name for both the light source and the node
        // FIXME - what's the right way to print a size_t? Is 'zu' universally available? stick with the safe version.
        light->mName.length = ::ai_snprintf(light->mName.data, MAXLEN, "ACLight_%i",static_cast<unsigned int>(mLights->size())-1);
        obj.name = std::string( light->mName.data );

        ASSIMP_LOG_DEBUG("AC3D: Light source encountered");
        obj.type = Object::Light;
    }
    else if (!ASSIMP_strincmp(buffer,"group",5))
    {
        obj.type = Object::Group;
    }
    else if (!ASSIMP_strincmp(buffer,"world",5))
    {
        obj.type = Object::World;
    }
    else obj.type = Object::Poly;
    while (GetNextLine())
    {
        if (TokenMatch(buffer,"kids",4))
        {
            SkipSpaces(&buffer);
            unsigned int num = strtoul10(buffer,&buffer);
            GetNextLine();
            if (num)
            {
                // load the children of this object recursively
                obj.children.reserve(num);
                for (unsigned int i = 0; i < num; ++i)
                    LoadObjectSection(obj.children);
            }
            return;
        }
        else if (TokenMatch(buffer,"name",4))
        {
            SkipSpaces(&buffer);
            AI_AC_GET_STRING(obj.name);

            // If this is a light source, we'll also need to store
            // the name of the node in it.
            if (light)
            {
                light->mName.Set(obj.name);
            }
        }
        else if (TokenMatch(buffer,"texture",7))
        {
            SkipSpaces(&buffer);
            AI_AC_GET_STRING(obj.texture);
        }
        else if (TokenMatch(buffer,"texrep",6))
        {
            SkipSpaces(&buffer);
            AI_AC_CHECKED_LOAD_FLOAT_ARRAY("",0,2,&obj.texRepeat);
            if (!obj.texRepeat.x || !obj.texRepeat.y)
                obj.texRepeat = aiVector2D (1.f,1.f);
        }
        else if (TokenMatch(buffer,"texoff",6))
        {
            SkipSpaces(&buffer);
            AI_AC_CHECKED_LOAD_FLOAT_ARRAY("",0,2,&obj.texOffset);
        }
        else if (TokenMatch(buffer,"rot",3))
        {
            SkipSpaces(&buffer);
            AI_AC_CHECKED_LOAD_FLOAT_ARRAY("",0,9,&obj.rotation);
        }
        else if (TokenMatch(buffer,"loc",3))
        {
            SkipSpaces(&buffer);
            AI_AC_CHECKED_LOAD_FLOAT_ARRAY("",0,3,&obj.translation);
        }
        else if (TokenMatch(buffer,"subdiv",6))
        {
            SkipSpaces(&buffer);
            obj.subDiv = strtoul10(buffer,&buffer);
        }
        else if (TokenMatch(buffer,"crease",6))
        {
            SkipSpaces(&buffer);
            obj.crease = fast_atof(buffer);
        }
        else if (TokenMatch(buffer,"numvert",7))
        {
            SkipSpaces(&buffer);

            unsigned int t = strtoul10(buffer,&buffer);
            if (t >= AI_MAX_ALLOC(aiVector3D)) {
                throw DeadlyImportError("AC3D: Too many vertices, would run out of memory");
            }
            obj.vertices.reserve(t);
            for (unsigned int i = 0; i < t;++i)
            {
                if (!GetNextLine())
                {
                    ASSIMP_LOG_ERROR("AC3D: Unexpected EOF: not all vertices have been parsed yet");
                    break;
                }
                else if (!IsNumeric(*buffer))
                {
                    ASSIMP_LOG_ERROR("AC3D: Unexpected token: not all vertices have been parsed yet");
                    --buffer; // make sure the line is processed a second time
                    break;
                }
                obj.vertices.push_back(aiVector3D());
                aiVector3D& v = obj.vertices.back();
                AI_AC_CHECKED_LOAD_FLOAT_ARRAY("",0,3,&v.x);
            }
        }
        else if (TokenMatch(buffer,"numsurf",7))
        {
            SkipSpaces(&buffer);

            bool Q3DWorkAround = false;

            const unsigned int t = strtoul10(buffer,&buffer);
            obj.surfaces.reserve(t);
            for (unsigned int i = 0; i < t;++i)
            {
                GetNextLine();
                if (!TokenMatch(buffer,"SURF",4))
                {
                    // FIX: this can occur for some files - Quick 3D for
                    // example writes no surf chunks
                    if (!Q3DWorkAround)
                    {
                        ASSIMP_LOG_WARN("AC3D: SURF token was expected");
                        ASSIMP_LOG_DEBUG("Continuing with Quick3D Workaround enabled");
                    }
                    --buffer; // make sure the line is processed a second time
                    // break; --- see fix notes above

                    Q3DWorkAround = true;
                }
                SkipSpaces(&buffer);
                obj.surfaces.push_back(Surface());
                Surface& surf = obj.surfaces.back();
                surf.flags = strtoul_cppstyle(buffer);

                while (1)
                {
                    if(!GetNextLine())
                    {
                        throw DeadlyImportError("AC3D: Unexpected EOF: surface is incomplete");
                    }
                    if (TokenMatch(buffer,"mat",3))
                    {
                        SkipSpaces(&buffer);
                        surf.mat = strtoul10(buffer);
                    }
                    else if (TokenMatch(buffer,"refs",4))
                    {
                        // --- see fix notes above
                        if (Q3DWorkAround)
                        {
                            if (!surf.entries.empty())
                            {
                                buffer -= 6;
                                break;
                            }
                        }

                        SkipSpaces(&buffer);
                        const unsigned int m = strtoul10(buffer);
                        surf.entries.reserve(m);

                        obj.numRefs += m;

                        for (unsigned int k = 0; k < m; ++k)
                        {
                            if(!GetNextLine())
                            {
                                ASSIMP_LOG_ERROR("AC3D: Unexpected EOF: surface references are incomplete");
                                break;
                            }
                            surf.entries.push_back(Surface::SurfaceEntry());
                            Surface::SurfaceEntry& entry = surf.entries.back();

                            entry.first = strtoul10(buffer,&buffer);
                            SkipSpaces(&buffer);
                            AI_AC_CHECKED_LOAD_FLOAT_ARRAY("",0,2,&entry.second);
                        }
                    }
                    else
                    {

                        --buffer; // make sure the line is processed a second time
                        break;
                    }
                }
            }
        }
    }
    ASSIMP_LOG_ERROR("AC3D: Unexpected EOF: \'kids\' line was expected");
}